

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_font_atlas_bake(nk_font_atlas *atlas,int *width,int *height,nk_font_atlas_format fmt)

{
  nk_tt__edge *pnVar1;
  long *plVar2;
  long lVar3;
  nk_vec2 *pnVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  short sVar8;
  short sVar9;
  nk_rune nVar10;
  nk_byte *data;
  uchar *puVar11;
  nk_baked_font *pnVar12;
  void *pvVar13;
  nk_rune *pnVar14;
  nk_vec2 nVar15;
  int iVar16;
  nk_tt__active_edge *z;
  int iVar17;
  nk_uint nVar18;
  nk_uint nVar19;
  nk_uint nVar20;
  nk_uint nVar21;
  nk_uint nVar22;
  nk_uint nVar23;
  nk_uint nVar24;
  uint uVar25;
  nk_font *pnVar26;
  long lVar27;
  nk_font_glyph *pnVar28;
  uint *puVar29;
  void *pvVar30;
  nk_tt__point *points;
  ulong uVar31;
  nk_tt__edge *p_00;
  nk_rp_rect *pnVar32;
  nk_handle nVar33;
  nk_rp_rect *pnVar34;
  nk_handle nVar35;
  nk_handle nVar36;
  nk_vec2 *pnVar37;
  nk_font_config *pnVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  float *pfVar45;
  nk_rune nVar46;
  nk_handle *pnVar47;
  void *pvVar48;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *tag_06;
  char *extraout_RDX;
  char *pcVar49;
  nk_size nVar50;
  long lVar51;
  void *p;
  nk_handle nVar52;
  long lVar53;
  ushort uVar54;
  int iVar55;
  uint uVar56;
  uint uVar57;
  undefined1 uVar58;
  int iVar59;
  nk_handle nVar60;
  ulong uVar61;
  ulong uVar62;
  nk_handle *alloc;
  int *piVar63;
  byte *pbVar64;
  int iVar65;
  byte *pbVar66;
  long lVar67;
  short *psVar68;
  nk_font_config *pnVar69;
  uchar *puVar70;
  ulong uVar71;
  nk_tt_fontinfo *pnVar72;
  int iVar73;
  ushort *puVar74;
  bool bVar75;
  float fVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float in_XMM3_Da;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float ya;
  int y0;
  int ix0;
  int x1;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  long local_478;
  nk_handle local_450;
  nk_handle local_448;
  nk_handle *local_440;
  int local_434;
  nk_font_config *local_430;
  int *local_428;
  nk_font_config *local_420;
  uchar *local_418;
  ulong local_410;
  nk_tt__edge *local_408;
  undefined8 local_400;
  float local_3f4;
  float local_3f0;
  int local_3ec;
  undefined1 local_3e8 [16];
  ulong local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  nk_tt_fontinfo *local_3b0;
  nk_tt__point *local_3a8;
  int local_3a0;
  nk_font_atlas_format local_39c;
  undefined4 local_398;
  int local_394;
  float local_390;
  float local_38c;
  int local_388;
  uint local_384;
  uint local_380;
  int local_37c;
  int local_378;
  int local_374;
  void *local_370;
  long local_368;
  size_t local_360;
  size_t local_358;
  ulong local_350;
  long local_348;
  nk_handle local_340;
  nk_handle local_338;
  nk_rp_coord *local_330;
  long local_328;
  nk_font_config *local_320;
  nk_handle *local_318;
  nk_font_config *local_310;
  long local_308;
  long local_300;
  long local_2f8;
  nk_handle local_2f0;
  uchar *local_2e8;
  nk_font_glyph *local_2e0;
  long local_2d8;
  ulong local_2d0;
  ulong local_2c8;
  int *local_2c0;
  size_t local_2b8;
  nk_rp_rect *local_2b0;
  size_t local_2a8;
  ulong local_2a0;
  ulong local_298;
  short *local_290;
  long local_288;
  long local_280;
  nk_rp_rect *local_278;
  nk_rp_rect *local_270;
  ulong local_268;
  long local_260;
  long local_258;
  long local_250;
  ulong local_248;
  int local_240;
  int local_23c;
  nk_rp_rect local_238;
  undefined8 local_228;
  nk_rune *pnStack_220;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3599,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x359a,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x359b,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x359c,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x359d,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (width == (int *)0x0) {
    __assert_fail("width",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x359f,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  local_39c = fmt;
  if (height == (int *)0x0) {
    __assert_fail("height",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x35a0,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  if (atlas->font_num == 0) {
    pnVar26 = nk_font_atlas_add_default(atlas,13.0,(nk_font_config *)0x0);
    atlas->default_font = pnVar26;
  }
  iVar43 = atlas->font_num;
  if ((long)iVar43 == 0) {
    __assert_fail("atlas->font_num",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x35ab,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  pnVar38 = atlas->config;
  if (pnVar38 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3190,
                  "void nk_font_baker_memory(nk_size *, int *, struct nk_font_config *, int)");
  }
  local_448.ptr = &atlas->temporary;
  atlas->glyph_count = 0;
  iVar55 = 0;
  pnVar69 = pnVar38;
  do {
    if (pnVar38->range == (nk_rune *)0x0) {
      pnVar69->range = nk_font_default_glyph_ranges::ranges;
    }
    iVar16 = nk_range_count(pnVar38->range);
    iVar55 = iVar55 + iVar16;
    iVar16 = nk_range_glyph_count(pnVar38->range,iVar16);
    lVar27 = (long)iVar16 + (long)atlas->glyph_count;
    atlas->glyph_count = (int)lVar27;
    pnVar38 = pnVar38->n;
  } while ((pnVar38 != pnVar69) ||
          (pnVar38 = pnVar69->next, pnVar69 = pnVar38, pnVar38 != (nk_font_config *)0x0));
  local_370 = (*(atlas->temporary).alloc)
                        ((atlas->temporary).userdata,(void *)0x0,
                         lVar27 * 0x2c + (long)iVar55 * 0x28 + (long)iVar43 * 0x48 + 0x88);
  if (local_370 == (void *)0x0) {
    __assert_fail("tmp",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x35b1,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  iVar43 = atlas->glyph_count;
  iVar55 = atlas->font_num;
  alloc = (nk_handle *)((long)local_370 + 7U & 0xfffffffffffffff8);
  pnVar47 = alloc + 0xd;
  alloc[9].ptr = pnVar47;
  alloc[10].ptr = pnVar47 + (long)iVar55 * 9;
  pvVar48 = (void *)((long)iVar43 * 0x1c + (long)(pnVar47 + (long)iVar55 * 9));
  alloc[0xb].ptr = pvVar48;
  alloc[0xc].ptr = (void *)((long)pvVar48 + (long)iVar43 * 0x10 + 7 & 0xfffffffffffffff8);
  nVar60 = *(nk_handle *)((long)local_448.ptr + 8);
  *alloc = *local_448.ptr;
  alloc[1] = nVar60;
  alloc[2] = *(nk_handle *)((long)local_448.ptr + 0x10);
  pnVar28 = (nk_font_glyph *)
            (*(atlas->permanent).alloc)
                      ((atlas->permanent).userdata,(void *)0x0,(long)atlas->glyph_count * 0x30);
  atlas->glyphs = pnVar28;
  if (pnVar28 == (nk_font_glyph *)0x0) {
    __assert_fail("atlas->glyphs",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x35b8,
                  "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                 );
  }
  (atlas->custom).w = 0xb5;
  (atlas->custom).h = 0x1c;
  pnVar38 = atlas->config;
  if (pnVar38 == (nk_font_config *)0x0) {
    __assert_fail("config_list",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x31c6,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  iVar43 = atlas->font_num;
  if (iVar43 == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x31c7,
                  "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                 );
  }
  iVar16 = 0;
  iVar55 = 0;
  local_430 = pnVar38;
  pnVar69 = pnVar38;
  do {
    do {
      iVar17 = nk_range_count(pnVar38->range);
      iVar16 = iVar16 + iVar17;
      iVar17 = nk_range_glyph_count(pnVar38->range,iVar17);
      iVar55 = iVar55 + iVar17;
      pnVar38 = pnVar38->n;
    } while (pnVar38 != pnVar69);
    pnVar38 = pnVar69->next;
    pnVar69 = pnVar38;
  } while (pnVar38 != (nk_font_config *)0x0);
  local_3d8 = CONCAT44(local_3d8._4_4_,iVar55);
  pvVar48 = alloc[9].ptr;
  pcVar49 = (char *)0x0;
  pnVar38 = local_430;
  do {
    local_3e8._0_8_ = pnVar38;
    tag = (char *)(long)(int)pcVar49;
    do {
      data = (nk_byte *)pnVar38->ttf_blob;
      *(nk_byte **)((long)pvVar48 + (long)tag * 0x48) = data;
      *(undefined4 *)((long)pvVar48 + (long)tag * 0x48 + 8) = 0;
      nVar18 = nk_tt__find_table(data,0x15ea60,tag);
      nVar19 = nk_tt__find_table(data,0x15ea65,tag_00);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x10) = nVar19;
      nVar20 = nk_tt__find_table(data,0x15ea6a,tag_01);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x14) = nVar20;
      nVar21 = nk_tt__find_table(data,0x15ea6f,tag_02);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x18) = nVar21;
      nVar22 = nk_tt__find_table(data,0x15ea74,tag_03);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x1c) = nVar22;
      nVar23 = nk_tt__find_table(data,0x15ea79,tag_04);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x20) = nVar23;
      nVar24 = nk_tt__find_table(data,0x15ea7e,tag_05);
      *(nk_uint *)((long)pvVar48 + (long)tag * 0x48 + 0x24) = nVar24;
      pcVar49 = tag_06;
      if ((((nVar18 == 0) || (nVar19 == 0)) || (nVar20 == 0)) || ((nVar21 == 0 || (nVar22 == 0)))) {
        bVar75 = true;
        goto LAB_00117750;
      }
      bVar75 = true;
      if (nVar23 == 0) goto LAB_00117750;
      nVar19 = nk_tt__find_table(data,0x15ea83,tag_06);
      if (nVar19 == 0) {
        uVar42 = 0xffff;
      }
      else {
        uVar42 = (uint)(ushort)(*(ushort *)(data + (ulong)nVar19 + 4) << 8 |
                               *(ushort *)(data + (ulong)nVar19 + 4) >> 8);
      }
      *(uint *)((long)pvVar48 + (long)tag * 0x48 + 0xc) = uVar42;
      uVar39 = *(ushort *)(data + (ulong)nVar18 + 2) << 8 |
               *(ushort *)(data + (ulong)nVar18 + 2) >> 8;
      *(undefined4 *)((long)pvVar48 + (long)tag * 0x48 + 0x28) = 0;
      pcVar49 = extraout_RDX;
      if (uVar39 != 0) {
        uVar42 = nVar18 + 4;
        pcVar49 = (char *)(ulong)uVar39;
        do {
          uVar39 = *(ushort *)(data + uVar42) << 8 | *(ushort *)(data + uVar42) >> 8;
          if ((uVar39 == 0) ||
             ((uVar39 == 3 &&
              ((uVar39 = *(ushort *)(data + (ulong)uVar42 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar42 + 2) >> 8, uVar39 == 10 || (uVar39 == 1)))
              ))) {
            uVar56 = *(uint *)(data + (ulong)uVar42 + 4);
            *(uint *)((long)pvVar48 + (long)tag * 0x48 + 0x28) =
                 (uVar56 >> 0x18 | (uVar56 & 0xff0000) >> 8 | (uVar56 & 0xff00) << 8 |
                 uVar56 << 0x18) + nVar18;
          }
          uVar42 = uVar42 + 8;
          pcVar49 = pcVar49 + -1;
        } while (pcVar49 != (char *)0x0);
      }
      bVar75 = true;
      if (*(int *)((long)pvVar48 + (long)tag * 0x48 + 0x28) == 0) goto LAB_00117750;
      pcVar49 = tag + 1;
      *(uint *)((long)pvVar48 + (long)tag * 0x48 + 0x2c) =
           (uint)(ushort)(*(ushort *)(data + (long)(int)nVar20 + 0x32) << 8 |
                         *(ushort *)(data + (long)(int)nVar20 + 0x32) >> 8);
      pnVar38 = pnVar38->n;
      tag = pcVar49;
    } while (pnVar38 != (nk_font_config *)local_3e8._0_8_);
    pnVar38 = *(nk_font_config **)local_3e8._0_8_;
    if (pnVar38 == (nk_font_config *)0x0) {
      *height = 0;
      uVar42 = (uint)(1000 < (int)local_3d8) * 0x200;
      iVar55 = uVar42 + 0x200;
      *width = iVar55;
      uVar56 = uVar42 | 0x1ff;
      puVar29 = (uint *)(*(atlas->temporary).alloc)((atlas->temporary).userdata,(void *)0x0,0x48);
      pvVar48 = (*(atlas->temporary).alloc)
                          ((atlas->temporary).userdata,(void *)0x0,(ulong)(uVar56 << 4));
      if ((puVar29 == (uint *)0x0) || (pvVar48 == (void *)0x0)) {
        if (puVar29 != (uint *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,puVar29);
        }
        if (pvVar48 != (void *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar48);
        }
      }
      else {
        alloc[4].id = iVar55;
        *(undefined4 *)((long)alloc + 0x24) = 0x8000;
        alloc[7].ptr = (void *)0x0;
        alloc[3].ptr = puVar29;
        alloc[8].ptr = pvVar48;
        *(undefined4 *)((long)alloc + 0x2c) = 1;
        alloc[5].id = iVar55;
        alloc[6].ptr = (void *)0x100000001;
        uVar44 = (ulong)(uVar42 + 0x1fe);
        pvVar13 = pvVar48;
        do {
          pvVar30 = pvVar13;
          *(void **)((long)pvVar30 + 8) = (void *)((long)pvVar30 + 0x10);
          uVar44 = uVar44 - 1;
          pvVar13 = (void *)((long)pvVar30 + 0x10);
        } while (uVar44 != 0);
        *(undefined8 *)((long)pvVar30 + 0x18) = 0;
        puVar29[3] = 1;
        puVar29[4] = 0;
        *(void **)(puVar29 + 8) = pvVar48;
        *(uint **)(puVar29 + 6) = puVar29 + 10;
        *puVar29 = uVar56;
        puVar29[1] = 0x7fff;
        puVar29[5] = uVar56;
        puVar29[2] = (uVar42 + 0x1fe + uVar56) / uVar56;
        puVar29[10] = 0;
        *(uint **)(puVar29 + 0xc) = puVar29 + 0xe;
        *(short *)(puVar29 + 0xe) = (short)uVar56;
        *(undefined2 *)((long)puVar29 + 0x3a) = 0xffff;
        puVar29[0x10] = 0;
        puVar29[0x11] = 0;
      }
      local_238.x = 0;
      local_238.y = 0;
      local_238.was_packed = 0;
      uVar42._0_2_ = (atlas->custom).w;
      uVar42._2_2_ = (atlas->custom).h;
      local_238._0_8_ = (ulong)uVar42 << 0x20;
      alloc[6].ptr = (void *)0x100000001;
      nk_rp_pack_rects((nk_rp_context *)alloc[3].ptr,&local_238,1);
      iVar55 = (uint)local_238.h + (uint)local_238.y;
      if ((int)((uint)local_238.h + (uint)local_238.y) < *height) {
        iVar55 = *height;
      }
      *height = iVar55;
      (atlas->custom).x = local_238.x;
      (atlas->custom).y = local_238.y;
      (atlas->custom).w = local_238.w;
      (atlas->custom).h = local_238.h;
      if (iVar43 < 1) {
        iVar17 = 0;
        iVar55 = 0;
        piVar63 = (int *)0x0;
      }
      else {
        local_440 = alloc + 3;
        local_428 = (int *)0x0;
        iVar55 = 0;
        iVar17 = 0;
        local_478 = 0;
        pnVar38 = local_430;
        do {
          local_478 = (long)(int)local_478;
          local_430 = pnVar38;
          do {
            pnVar14 = pnVar38->range;
            nVar46 = *pnVar14;
            if (nVar46 == 0) {
              local_3c8 = 0;
              local_410 = 0;
            }
            else {
              local_3c8 = 0;
              local_410 = 0;
              do {
                if (pnVar14[local_3c8 * 2 + 1] == 0) break;
                local_410 = (ulong)(((int)local_410 - nVar46) + pnVar14[local_3c8 * 2 + 1] + 1);
                nVar46 = pnVar14[local_3c8 * 2 + 2];
                local_3c8 = local_3c8 + 1;
              } while (nVar46 != 0);
            }
            pnVar72 = (nk_tt_fontinfo *)(local_478 * 0x48 + (long)alloc[9].ptr);
            pfVar45 = (float *)((long)iVar17 * 0x28 + (long)alloc[0xc].ptr);
            *(float **)&pnVar72[1].fontstart = pfVar45;
            pnVar72[1].loca = (int)local_3c8;
            local_408 = (nk_tt__edge *)CONCAT44(local_408._4_4_,iVar17);
            if ((int)local_3c8 != 0) {
              fVar83 = pnVar38->size;
              pvVar48 = alloc[10].ptr;
              uVar44 = 0;
              do {
                *pfVar45 = fVar83;
                pfVar45[1] = (float)pnVar14[uVar44 * 2];
                nVar46 = pnVar14[uVar44 * 2 + 1];
                nVar10 = pnVar14[uVar44 * 2];
                pfVar45[4] = (float)((nVar46 - nVar10) + 1);
                *(void **)(pfVar45 + 6) = (void *)((long)(int)local_428 * 0x1c + (long)pvVar48);
                local_428 = (int *)(ulong)((nVar46 - nVar10) + (int)local_428 + 1);
                uVar44 = uVar44 + 1;
                pfVar45 = pfVar45 + 10;
              } while ((local_3c8 & 0xffffffff) != uVar44);
            }
            pnVar72[1].data = (uchar *)((long)iVar55 * 0x10 + (long)alloc[0xb].ptr);
            nk_tt_PackSetOversampling
                      ((nk_tt_pack_context *)local_440,(uint)pnVar38->oversample_h,
                       (uint)pnVar38->oversample_v);
            iVar17 = pnVar72[1].loca;
            if ((long)iVar17 < 1) {
              uVar44 = 0;
            }
            else {
              uVar31._0_4_ = pnVar72[1].fontstart;
              uVar31._4_4_ = pnVar72[1].numGlyphs;
              local_3e8._0_8_ = pnVar72[1].data + 6;
              lVar27 = 0;
              uVar44 = 0;
              local_400 = uVar31;
              do {
                fVar83 = *(float *)(uVar31 + lVar27 * 0x28);
                if (fVar83 <= 0.0) {
                  fVar83 = -fVar83;
                  uVar42 = (uint)(ushort)(*(ushort *)(pnVar72->data + (long)pnVar72->head + 0x12) <<
                                          8 | *(ushort *)
                                               (pnVar72->data + (long)pnVar72->head + 0x12) >> 8);
                }
                else {
                  puVar70 = pnVar72->data;
                  lVar51 = (long)pnVar72->hhea;
                  uVar42 = ((int)(short)((ushort)puVar70[lVar51 + 4] << 8) |
                           (uint)puVar70[lVar51 + 5]) -
                           ((int)(short)((ushort)puVar70[lVar51 + 6] << 8) |
                           (uint)puVar70[lVar51 + 7]);
                }
                fVar83 = fVar83 / (float)(int)uVar42;
                lVar51 = uVar31 + lVar27 * 0x28;
                *(undefined1 *)(lVar51 + 0x20) = *(undefined1 *)(alloc + 6);
                *(undefined1 *)(lVar51 + 0x21) = *(undefined1 *)((long)alloc + 0x34);
                if (0 < *(int *)(lVar51 + 0x10)) {
                  psVar68 = (short *)((long)(int)uVar44 * 0x10 + local_3e8._0_8_);
                  lVar53 = 0;
                  do {
                    if (*(int *)(lVar51 + 4) == 0) {
                      iVar59 = *(int *)(*(long *)(lVar51 + 8) + lVar53 * 4);
                    }
                    else {
                      iVar59 = *(int *)(lVar51 + 4) + (int)lVar53;
                    }
                    iVar59 = nk_tt_FindGlyphIndex(pnVar72,iVar59);
                    uVar42 = alloc[6].id;
                    uVar56 = *(uint *)((long)alloc + 0x34);
                    nk_tt_GetGlyphBitmapBoxSubpixel
                              (pnVar72,iVar59,(float)uVar42 * fVar83,(float)uVar56 * fVar83,fVar83,
                               in_XMM3_Da,&local_238.id,&local_450.id,(int *)&local_3d0,&local_434);
                    sVar8 = (short)*(undefined4 *)((long)alloc + 0x2c);
                    psVar68[-1] = (((short)(int)local_3d0 + (short)uVar42) - (short)local_238.id) +
                                  sVar8 + -1;
                    *psVar68 = ~local_450._0_2_ + sVar8 + (short)uVar56 + (short)local_434;
                    lVar53 = lVar53 + 1;
                    psVar68 = psVar68 + 8;
                  } while (lVar53 < *(int *)(lVar51 + 0x10));
                  uVar44 = (ulong)(uint)((int)uVar44 + (int)lVar53);
                  uVar31 = local_400;
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 != iVar17);
            }
            nk_rp_pack_rects((nk_rp_context *)local_440->ptr,(nk_rp_rect *)pnVar72[1].data,
                             (int)uVar44);
            if (0 < (int)uVar44) {
              puVar70 = pnVar72[1].data;
              lVar27 = 0;
              do {
                if (*(int *)(puVar70 + lVar27 + 0xc) != 0) {
                  iVar17 = (uint)*(ushort *)(puVar70 + lVar27 + 6) +
                           (uint)*(ushort *)(puVar70 + lVar27 + 10);
                  if ((int)((uint)*(ushort *)(puVar70 + lVar27 + 6) +
                           (uint)*(ushort *)(puVar70 + lVar27 + 10)) < *height) {
                    iVar17 = *height;
                  }
                  *height = iVar17;
                }
                lVar27 = lVar27 + 0x10;
              } while (uVar44 << 4 != lVar27);
            }
            local_478 = local_478 + 1;
            iVar17 = (int)local_408 + (int)(float)local_3c8;
            iVar55 = iVar55 + (int)local_410;
            pnVar38 = pnVar38->n;
          } while (pnVar38 != local_430);
          piVar63 = local_428;
        } while (((int)local_478 < iVar43) &&
                (pnVar38 = local_430->next, pnVar38 != (nk_font_config *)0x0));
      }
      if (iVar55 != (int)local_3d8) {
        __assert_fail("rect_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x3220,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if ((int)piVar63 != (int)local_3d8) {
        __assert_fail("char_n == total_glyph_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x3221,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      if (iVar17 != iVar16) {
        __assert_fail("range_n == total_range_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x3222,
                      "int nk_font_bake_pack(struct nk_font_baker *, nk_size *, int *, int *, struct nk_recti *, const struct nk_font_config *, int, struct nk_allocator *)"
                     );
      }
      uVar42 = *height - 1U >> 1 | *height - 1U;
      uVar42 = uVar42 >> 2 | uVar42;
      uVar42 = uVar42 >> 4 | uVar42;
      uVar42 = uVar42 >> 8 | uVar42;
      iVar43 = (uVar42 >> 0x10 | uVar42) + 1;
      *height = iVar43;
      pcVar49 = (char *)((long)iVar43 * (long)*width);
      bVar75 = false;
LAB_00117750:
      if (bVar75) {
        (*(atlas->temporary).free)(*local_448.ptr,local_370);
        if (atlas->glyphs != (nk_font_glyph *)0x0) {
          (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
          atlas->glyphs = (nk_font_glyph *)0x0;
        }
        if (atlas->pixel != (void *)0x0) {
          (*(atlas->temporary).free)((atlas->temporary).userdata,atlas->pixel);
          atlas->pixel = (void *)0x0;
        }
        pvVar48 = (void *)0x0;
      }
      else {
        pvVar48 = (*(atlas->temporary).alloc)(*local_448.ptr,(void *)0x0,(nk_size)pcVar49);
        atlas->pixel = pvVar48;
        if (pvVar48 == (void *)0x0) {
          __assert_fail("atlas->pixel",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x35c5,
                        "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                       );
        }
        lVar27 = (long)*width;
        if (lVar27 == 0) {
          __assert_fail("width",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3233,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        iVar43 = *height;
        if (iVar43 == 0) {
          __assert_fail("height",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3234,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        local_420 = atlas->config;
        if (local_420 == (nk_font_config *)0x0) {
          __assert_fail("config_list",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3235,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        if (alloc == (nk_handle *)0x0) {
          __assert_fail("baker",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3236,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        iVar55 = atlas->font_num;
        if (iVar55 == 0) {
          __assert_fail("font_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3237,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        if (atlas->glyph_count == 0) {
          __assert_fail("glyphs_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x3238,
                        "void nk_font_bake(struct nk_font_baker *, void *, int, int, struct nk_font_glyph *, int, const struct nk_font_config *, int)"
                       );
        }
        local_2e0 = atlas->glyphs;
        if (local_2e0 != (nk_font_glyph *)0x0) {
          nk_zero(pvVar48,iVar43 * lVar27);
          alloc[7].ptr = pvVar48;
          *(int *)((long)alloc + 0x24) = iVar43;
          if (iVar55 < 1) {
            (*(code *)alloc[2])(*alloc,alloc[8].ptr);
            (*(code *)alloc[2])(*alloc,alloc[3].ptr);
          }
          else {
            local_318 = alloc + 3;
            local_250 = 0;
            local_358 = 4;
            local_270 = (nk_rp_rect *)&local_238.w;
            local_258 = 0;
            local_360 = 4;
            local_278 = (nk_rp_rect *)&local_238.w;
            lVar51 = 0;
            pnVar38 = local_420;
            local_3a0 = iVar43;
            local_328 = lVar27;
            do {
              lVar51 = (long)(int)lVar51;
              local_320 = pnVar38;
              do {
                pvVar48 = alloc[9].ptr;
                local_310 = pnVar38;
                local_308 = lVar51;
                nk_tt_PackSetOversampling
                          ((nk_tt_pack_context *)local_318,(uint)pnVar38->oversample_h,
                           (uint)pnVar38->oversample_v);
                local_300 = (long)*(int *)((long)pvVar48 + lVar51 * 0x48 + 0x40);
                local_394 = alloc[6].id;
                local_398 = *(undefined4 *)((long)alloc + 0x34);
                if (0 < local_300) {
                  local_3b0 = (nk_tt_fontinfo *)((long)pvVar48 + lVar51 * 0x48);
                  puVar70 = local_3b0[1].data;
                  local_368._0_4_ = local_3b0[1].fontstart;
                  local_368._4_4_ = local_3b0[1].numGlyphs;
                  lVar51 = 0;
                  lVar27 = 0;
                  local_2e8 = puVar70;
                  do {
                    uVar79 = 0x80000000;
                    uVar78 = 0x80000000;
                    uVar77 = 0x80000000;
                    fVar83 = *(float *)(local_368 + lVar51 * 0x28);
                    if (fVar83 <= 0.0) {
                      fVar83 = -fVar83;
                      uVar42 = (uint)(ushort)(*(ushort *)
                                               (local_3b0->data + (long)local_3b0->head + 0x12) << 8
                                             | *(ushort *)
                                                (local_3b0->data + (long)local_3b0->head + 0x12) >>
                                               8);
                    }
                    else {
                      puVar11 = local_3b0->data;
                      lVar53 = (long)local_3b0->hhea;
                      uVar42 = ((int)(short)((ushort)puVar11[lVar53 + 4] << 8) |
                               (uint)puVar11[lVar53 + 5]) -
                               ((int)(short)((ushort)puVar11[lVar53 + 6] << 8) |
                               (uint)puVar11[lVar53 + 7]);
                      uVar77 = 0;
                      uVar78 = 0;
                      uVar79 = 0;
                    }
                    fVar83 = fVar83 / (float)(int)uVar42;
                    lVar53 = local_368 + lVar51 * 0x28;
                    bVar5 = *(byte *)(lVar53 + 0x20);
                    fVar76 = (float)bVar5;
                    alloc[6].id = (uint)bVar5;
                    local_3f0 = 0.0;
                    local_3f4 = 0.0;
                    if (bVar5 != 0) {
                      local_3f4 = (float)(int)(1 - (uint)bVar5) / (fVar76 + fVar76);
                    }
                    bVar5 = *(byte *)(lVar53 + 0x21);
                    *(uint *)((long)alloc + 0x34) = (uint)bVar5;
                    fVar80 = (float)bVar5;
                    if (bVar5 != 0) {
                      local_3f0 = (float)(int)(1 - (uint)bVar5) / (fVar80 + fVar80);
                    }
                    local_2f8 = lVar51;
                    if (0 < *(int *)(lVar53 + 0x10)) {
                      local_38c = 1.0 / fVar76;
                      local_390 = 1.0 / fVar80;
                      lVar27 = (long)(int)lVar27;
                      lVar51 = 0;
                      local_3c8 = CONCAT44(uVar77,fVar83);
                      uStack_3c0 = uVar78;
                      uStack_3bc = uVar79;
                      local_2d8 = lVar53;
                      do {
                        pnVar72 = local_3b0;
                        if (*(int *)(puVar70 + lVar27 * 0x10 + 0xc) != 0) {
                          if (*(int *)(lVar53 + 4) == 0) {
                            iVar43 = *(int *)(*(long *)(lVar53 + 8) + lVar51 * 4);
                          }
                          else {
                            iVar43 = *(int *)(lVar53 + 4) + (int)lVar51;
                          }
                          puVar70 = puVar70 + lVar27 * 0x10;
                          local_290 = (short *)(lVar51 * 0x1c + *(long *)(lVar53 + 0x18));
                          local_288 = lVar51;
                          local_280 = lVar27;
                          iVar59 = nk_tt_FindGlyphIndex(local_3b0,iVar43);
                          iVar43 = *(int *)((long)alloc + 0x2c);
                          uVar54 = *(short *)(puVar70 + 8) + (short)iVar43;
                          pvVar48 = (void *)(ulong)uVar54;
                          *(ushort *)(puVar70 + 8) = uVar54;
                          uVar40 = *(short *)(puVar70 + 10) + (short)iVar43;
                          *(ushort *)(puVar70 + 10) = uVar40;
                          iVar16 = *(int *)(puVar70 + 4);
                          *(short *)(puVar70 + 4) = (short)(iVar16 - iVar43);
                          uVar39 = *(ushort *)(puVar70 + 6);
                          *(short *)(puVar70 + 6) = (short)((uint)uVar39 - iVar43);
                          puVar11 = pnVar72->data;
                          uVar41 = *(ushort *)(puVar11 + (long)pnVar72->hhea + 0x22) << 8 |
                                   *(ushort *)(puVar11 + (long)pnVar72->hhea + 0x22) >> 8;
                          iVar17 = pnVar72->hmtx;
                          lVar27 = (ulong)uVar41 * 4 + (long)iVar17 + -4;
                          lVar51 = (ulong)uVar41 * 4 + (long)iVar17 + -3;
                          if (iVar59 < (int)(uint)uVar41) {
                            lVar27 = (long)(iVar59 * 4) + (long)iVar17;
                            lVar51 = (long)(iVar59 * 4) + 1 + (long)iVar17;
                          }
                          local_380 = (uint)puVar11[lVar27];
                          local_384 = (uint)puVar11[lVar51];
                          uVar42 = alloc[6].id;
                          uVar56 = *(uint *)((long)alloc + 0x34);
                          fVar80 = (float)uVar42 * (float)local_3c8;
                          fVar81 = (float)uVar56 * (float)local_3c8;
                          fVar76 = (float)local_3c8;
                          local_418 = puVar70;
                          nk_tt_GetGlyphBitmapBoxSubpixel
                                    (pnVar72,iVar59,fVar80,fVar81,(float)local_3c8,fVar83,&local_378
                                     ,&local_37c,&local_23c,&local_240);
                          local_348 = (ulong)uVar54 + (long)alloc[7].ptr;
                          local_3ec = alloc[5].id;
                          uVar42 = (iVar16 - iVar43 & 0xffffU) - uVar42;
                          uVar44 = (ulong)uVar42;
                          uVar25 = nk_tt_GetGlyphShape(pnVar72,(nk_allocator *)alloc,iVar59,
                                                       (nk_tt_vertex **)&local_3d0);
                          nk_tt_GetGlyphBitmapBoxSubpixel
                                    (pnVar72,iVar59,fVar80,fVar81,fVar76,fVar83,&local_434,
                                     &local_374,(int *)0x0,(int *)0x0);
                          iVar16 = local_374;
                          uVar42 = uVar42 + 1;
                          local_410 = uVar44;
                          if (uVar42 != 0) {
                            uVar56 = ((uint)uVar39 - iVar43 & 0xffff) - uVar56;
                            if (uVar56 + 1 != 0) {
                              lVar27 = CONCAT44(local_3d0._4_4_,(int)local_3d0);
                              local_3e8._0_4_ = local_434;
                              local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                              if ((int)uVar25 < 1) {
                                uVar44 = 0;
                              }
                              else {
                                lVar51 = 0;
                                uVar44 = 0;
                                do {
                                  uVar44 = (ulong)((int)uVar44 +
                                                  (uint)(*(char *)(lVar27 + 8 + lVar51) == '\x01'));
                                  lVar51 = lVar51 + 10;
                                } while ((ulong)uVar25 * 10 != lVar51);
                              }
                              if ((int)uVar44 == 0) {
LAB_00117fbf:
                                points = (nk_tt__point *)0x0;
                              }
                              else {
                                pvVar48 = (*alloc[1])(*alloc,(void *)0x0,(long)(int)uVar44 << 2);
                                if (pvVar48 == (void *)0x0) {
                                  uVar44 = 0;
                                  goto LAB_00117fbf;
                                }
                                fVar83 = fVar81;
                                if (fVar80 <= fVar81) {
                                  fVar83 = fVar80;
                                }
                                iVar43 = 0;
                                points = (nk_tt__point *)0x0;
                                local_400 = uVar44;
                                iVar17 = 0;
                                do {
                                  if (iVar17 == 0) {
LAB_00117e0b:
                                    local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                                    if ((int)uVar25 < 1) {
                                      lVar51 = -1;
                                    }
                                    else {
                                      uVar57 = 0xffffffff;
                                      fVar82 = 0.0;
                                      lVar51 = 0;
                                      fVar76 = 0.0;
                                      do {
                                        cVar6 = *(char *)(lVar27 + 8 + lVar51);
                                        if (cVar6 == '\x03') {
                                          nk_tt__tesselate_curve
                                                    (points,&local_238.id,fVar76,fVar82,
                                                     (float)(int)*(short *)(lVar27 + 4 + lVar51),
                                                     (float)(int)*(short *)(lVar27 + 6 + lVar51),
                                                     (float)(int)*(short *)(lVar27 + lVar51),
                                                     (float)(int)*(short *)(lVar27 + 2 + lVar51),
                                                     (0.35 / fVar83) * (0.35 / fVar83),0);
                                          fVar76 = (float)(int)*(short *)(lVar27 + lVar51);
                                          fVar82 = (float)(int)*(short *)(lVar27 + 2 + lVar51);
                                          uVar44 = local_238._0_8_;
                                        }
                                        else {
                                          if (cVar6 == '\x02') {
                                            sVar8 = *(short *)(lVar27 + lVar51);
                                            sVar9 = *(short *)(lVar27 + 2 + lVar51);
                                          }
                                          else {
                                            uVar44 = local_238._0_8_;
                                            if (cVar6 != '\x01') goto LAB_00117f4a;
                                            if (-1 < (int)uVar57) {
                                              *(int *)((long)pvVar48 + (ulong)uVar57 * 4) =
                                                   local_238.id - iVar43;
                                            }
                                            uVar57 = uVar57 + 1;
                                            sVar8 = *(short *)(lVar27 + lVar51);
                                            sVar9 = *(short *)(lVar27 + 2 + lVar51);
                                            iVar43 = local_238.id;
                                          }
                                          uVar44 = CONCAT44(local_238._4_4_,local_238.id + 1);
                                          fVar82 = (float)(int)sVar9;
                                          fVar76 = (float)(int)sVar8;
                                          if (points != (nk_tt__point *)0x0) {
                                            points[local_238.id].x = fVar76;
                                            points[local_238.id].y = fVar82;
                                          }
                                        }
LAB_00117f4a:
                                        local_238._0_8_ = uVar44;
                                        lVar51 = lVar51 + 10;
                                      } while ((ulong)uVar25 * 10 != lVar51);
                                      lVar51 = (long)(int)uVar57;
                                    }
                                    *(int *)((long)pvVar48 + lVar51 * 4) = local_238.id - iVar43;
                                    bVar75 = true;
                                  }
                                  else {
                                    bVar75 = false;
                                    points = (nk_tt__point *)
                                             (*(code *)alloc[1])(*alloc,(void *)0x0,
                                                                 (long)local_238.id << 3);
                                    if (points != (nk_tt__point *)0x0) goto LAB_00117e0b;
                                    points = (nk_tt__point *)0x0;
                                  }
                                  if (!bVar75) {
                                    (*(code *)alloc[2])(*alloc,points);
                                    (*(code *)alloc[2])(*alloc,pvVar48);
                                    uVar44 = 0;
                                    pvVar48 = (void *)0x0;
                                    goto LAB_00117fbf;
                                  }
                                  bVar75 = iVar17 == 0;
                                  uVar44 = local_400;
                                  iVar17 = iVar17 + 1;
                                } while (bVar75);
                              }
                              if (points != (nk_tt__point *)0x0) {
                                if ((int)uVar44 < 1) {
                                  nVar50 = 0x14;
                                }
                                else {
                                  uVar31 = 0;
                                  lVar27 = 0;
                                  do {
                                    lVar27 = (long)(int)lVar27 +
                                             (long)*(int *)((long)pvVar48 + uVar31 * 4);
                                    uVar31 = uVar31 + 1;
                                  } while ((uVar44 & 0xffffffff) != uVar31);
                                  nVar50 = lVar27 * 0x14 + 0x14;
                                }
                                local_3a8 = points;
                                p_00 = (nk_tt__edge *)(*(code *)alloc[1])(*alloc,(void *)0x0,nVar50)
                                ;
                                local_408 = p_00;
                                if (p_00 != (nk_tt__edge *)0x0) {
                                  if ((int)uVar44 < 1) {
                                    uVar25 = 0;
                                  }
                                  else {
                                    uVar31 = 0;
                                    uVar25 = 0;
                                    iVar43 = 0;
                                    do {
                                      iVar17 = *(int *)((long)pvVar48 + uVar31 * 4);
                                      if (0 < iVar17) {
                                        uVar62 = (ulong)(iVar17 - 1);
                                        uVar61 = 0;
                                        do {
                                          iVar59 = (int)uVar62;
                                          fVar83 = local_3a8[(long)iVar43 + (long)iVar59].y;
                                          fVar76 = local_3a8[(long)iVar43 + uVar61].y;
                                          if ((fVar83 != fVar76) || (NAN(fVar83) || NAN(fVar76))) {
                                            iVar65 = (int)uVar61;
                                            iVar73 = iVar59;
                                            if (fVar83 <= fVar76) {
                                              iVar73 = iVar65;
                                              iVar65 = iVar59;
                                            }
                                            p_00[(int)uVar25].invert = (uint)(fVar76 < fVar83);
                                            p_00[(int)uVar25].x0 =
                                                 local_3a8[(long)iVar43 + (long)iVar73].x * fVar80 +
                                                 0.0;
                                            p_00[(int)uVar25].y0 =
                                                 local_3a8[(long)iVar43 + (long)iVar73].y * -fVar81
                                                 + 0.0;
                                            p_00[(int)uVar25].x1 =
                                                 local_3a8[(long)iVar43 + (long)iVar65].x * fVar80 +
                                                 0.0;
                                            p_00[(int)uVar25].y1 =
                                                 local_3a8[(long)iVar43 + (long)iVar65].y * -fVar81
                                                 + 0.0;
                                            uVar25 = uVar25 + 1;
                                          }
                                          uVar62 = uVar61 & 0xffffffff;
                                          uVar61 = uVar61 + 1;
                                        } while ((long)uVar61 <
                                                 (long)*(int *)((long)pvVar48 + uVar31 * 4));
                                      }
                                      iVar43 = iVar43 + iVar17;
                                      uVar31 = uVar31 + 1;
                                    } while (uVar31 != (uVar44 & 0xffffffff));
                                  }
                                  nk_tt__sort_edges_quicksort(p_00,uVar25);
                                  pnVar32 = &local_238;
                                  if (1 < (int)uVar25) {
                                    uVar44 = 1;
                                    do {
                                      fVar83 = p_00[uVar44].x0;
                                      fVar76 = p_00[uVar44].y0;
                                      iVar43 = p_00[uVar44].invert;
                                      local_238._8_4_ = iVar43;
                                      local_238.id = (int)p_00[uVar44].x1;
                                      local_238._4_4_ = p_00[uVar44].y1;
                                      uVar31 = uVar44 & 0xffffffff;
                                      do {
                                        uVar57 = (uint)uVar31;
                                        if ((int)uVar57 < 1) break;
                                        fVar80 = p_00[uVar31 - 1].y0;
                                        if (fVar76 < fVar80) {
                                          pnVar1 = p_00 + uVar31;
                                          pnVar1->invert = pnVar1[-1].invert;
                                          fVar81 = pnVar1[-1].y0;
                                          fVar82 = pnVar1[-1].x1;
                                          fVar84 = pnVar1[-1].y1;
                                          pnVar1->x0 = pnVar1[-1].x0;
                                          pnVar1->y0 = fVar81;
                                          pnVar1->x1 = fVar82;
                                          pnVar1->y1 = fVar84;
                                          uVar31 = (ulong)(uVar57 - 1);
                                        }
                                        uVar57 = (uint)uVar31;
                                      } while (fVar76 < fVar80);
                                      if (uVar44 != uVar57) {
                                        p_00[(int)uVar57].x0 = fVar83;
                                        p_00[(int)uVar57].y0 = fVar76;
                                        p_00[(int)uVar57].x1 = (float)local_238.id;
                                        p_00[(int)uVar57].y1 = (float)local_238._4_4_;
                                        p_00[(int)uVar57].invert = iVar43;
                                      }
                                      uVar44 = uVar44 + 1;
                                    } while (uVar44 != uVar25);
                                  }
                                  local_450.ptr = (nk_tt__active_edge *)0x0;
                                  nVar60 = *alloc;
                                  local_340 = alloc[1];
                                  local_2f0 = alloc[2];
                                  if (0x40 < (int)uVar42) {
                                    pnVar32 = (nk_rp_rect *)
                                              (*(code *)local_340)
                                                        (nVar60,(void *)0x0,(ulong)uVar42 * 8 + 4);
                                  }
                                  p_00[(int)uVar25].y0 = (float)(int)(uVar56 + 1 + iVar16) + 1.0;
                                  local_338 = nVar60;
                                  if (uVar56 < 0x7fffffff) {
                                    local_348 = local_348 + (int)((uint)uVar40 * local_3ec);
                                    local_260 = (long)(int)uVar42;
                                    local_428 = &pnVar32->id + local_260;
                                    local_298 = (ulong)((uint)pnVar32 & 3);
                                    local_2a8 = 4 - local_298;
                                    local_2b0 = (nk_rp_rect *)(local_2a8 + (long)pnVar32);
                                    local_2a0 = (ulong)((uint)local_428 & 3);
                                    local_430 = (nk_font_config *)
                                                CONCAT44(local_430._4_4_,(float)(int)local_3e8._0_4_
                                                        );
                                    local_2b8 = 4 - local_2a0;
                                    local_2c0 = (int *)((long)local_428 + local_2b8);
                                    local_330 = (nk_rp_coord *)(local_428 + 1);
                                    local_268 = local_260 * 4;
                                    local_388 = (int)local_410 + 2;
                                    local_350 = (long)local_388 * 4;
                                    local_2c8 = local_268 - local_2a8;
                                    fVar83 = (float)(int)uVar42;
                                    local_2d0 = local_350 - local_2b8;
                                    local_3d8 = 0;
                                    local_448.ptr = (nk_handle *)0x0;
                                    nVar35.ptr = (nk_tt__active_edge *)0x0;
                                    local_440 = (nk_handle *)((ulong)local_440 & 0xffffffff00000000)
                                    ;
                                    local_248 = 0;
                                    do {
                                      fVar76 = (float)iVar16;
                                      fVar80 = fVar76 + 1.0;
                                      pnVar34 = pnVar32;
                                      uVar44 = local_268;
                                      if (local_268 < 0xc) {
LAB_00118452:
                                        memset(pnVar34,0,uVar44);
                                      }
                                      else {
                                        if (local_298 != 0) {
                                          memset(pnVar32,0,local_2a8);
                                          uVar44 = local_2c8;
                                          pnVar34 = local_2b0;
                                        }
                                        memset(pnVar34,0,uVar44 & 0xfffffffffffffffc);
                                        if ((uVar44 & 3) != 0) {
                                          pnVar34 = (nk_rp_rect *)
                                                    ((long)&pnVar34->id +
                                                    (uVar44 & 0xfffffffffffffffc));
                                          uVar44 = uVar44 & 3;
                                          goto LAB_00118452;
                                        }
                                      }
                                      if (local_350 < 0xc) {
                                        uVar31 = local_350;
                                        piVar63 = local_428;
                                        if (local_388 != 0) {
LAB_001184e2:
                                          memset(piVar63,0,uVar31);
                                        }
                                      }
                                      else {
                                        piVar63 = local_428;
                                        uVar44 = local_350;
                                        if (local_2a0 != 0) {
                                          memset(local_428,0,local_2b8);
                                          piVar63 = local_2c0;
                                          uVar44 = local_2d0;
                                        }
                                        memset(piVar63,0,uVar44 & 0xfffffffffffffffc);
                                        if ((uVar44 & 3) != 0) {
                                          uVar31 = uVar44 & 3;
                                          piVar63 = (int *)((long)piVar63 +
                                                           (uVar44 & 0xfffffffffffffffc));
                                          goto LAB_001184e2;
                                        }
                                      }
                                      nVar60 = local_448;
                                      if ((nk_tt__active_edge *)local_450.ptr !=
                                          (nk_tt__active_edge *)0x0) {
                                        nVar33 = local_450;
                                        nVar36 = (nk_handle)&local_450;
                                        do {
                                          nVar52 = nVar33;
                                          if (*(float *)((long)nVar33.ptr + 0x1c) <= fVar76) {
                                            *(void **)nVar36.ptr = *nVar33.ptr;
                                            if ((*(float *)((long)nVar33.ptr + 0x14) == 0.0) &&
                                               (!NAN(*(float *)((long)nVar33.ptr + 0x14)))) {
                                              __assert_fail("z->direction",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x2e7a,
                                                  "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                                                  );
                                            }
                                            *(float *)((long)nVar33.ptr + 0x14) = 0.0;
                                            *(nk_handle *)nVar33.ptr = (void *)nVar35;
                                            nVar52 = nVar36;
                                            nVar35 = nVar33;
                                          }
                                          nVar33 = *nVar52.ptr;
                                          nVar36 = nVar52;
                                        } while ((nk_tt__active_edge *)nVar33.ptr !=
                                                 (nk_tt__active_edge *)0x0);
                                      }
                                      fVar81 = p_00->y0;
                                      nVar33 = local_450;
                                      while (fVar81 <= fVar80) {
                                        if ((fVar81 != p_00->y1) || (NAN(fVar81) || NAN(p_00->y1)))
                                        {
                                          if ((nk_handle *)nVar35.ptr == (nk_handle *)0x0) {
                                            nVar36 = nVar35;
                                            if ((int)local_440 == 0) {
                                              nVar35.ptr = (*local_340.ptr)(local_338,(void *)0x0,
                                                                            0x6408);
                                              if ((nk_handle *)nVar35.ptr == (nk_handle *)0x0) {
                                                nVar52.ptr = (nk_tt__active_edge *)0x0;
                                                goto LAB_00118c5b;
                                              }
                                              *(nk_handle *)nVar35.ptr = (void *)nVar60;
                                              local_440 = (nk_handle *)CONCAT44(local_440._4_4_,800)
                                              ;
                                              nVar60.ptr = nVar35.ptr;
                                            }
                                            lVar27 = (long)(int)local_440;
                                            local_440 = (nk_handle *)
                                                        CONCAT44(local_440._4_4_,(int)local_440 + -1
                                                                );
                                            nVar52.ptr = nVar60.ptr + lVar27 * 0x20 + -0x20;
                                          }
                                          else {
                                            nVar36.ptr = *nVar35.ptr;
                                            nVar52 = nVar35;
                                          }
LAB_00118c5b:
                                          nVar35 = nVar36;
                                          if ((nk_tt__active_edge *)nVar52.ptr !=
                                              (nk_tt__active_edge *)0x0) {
                                            fVar81 = p_00->x0;
                                            fVar82 = p_00->y0;
                                            fVar84 = p_00->y1;
                                            fVar85 = (p_00->x1 - fVar81) / (fVar84 - fVar82);
                                            *(float *)((long)nVar52.ptr + 0xc) = fVar85;
                                            *(uint *)((long)nVar52.ptr + 0x10) =
                                                 -(uint)(fVar85 != 0.0) & (uint)(1.0 / fVar85);
                                            *(float *)((long)nVar52.ptr + 8) =
                                                 ((fVar76 - fVar82) * fVar85 + fVar81) -
                                                 local_430._0_4_;
                                            *(float *)((long)nVar52.ptr + 0x14) =
                                                 *(float *)(&DAT_001522d0 +
                                                           (ulong)(p_00->invert == 0) * 4);
                                            *(float *)((long)nVar52.ptr + 0x18) = fVar82;
                                            *(float *)((long)nVar52.ptr + 0x1c) = fVar84;
                                            *(undefined8 *)nVar52.ptr = 0;
                                            if (fVar84 < fVar76) {
                                              local_450 = nVar33;
                                              __assert_fail("z->ey >= scan_y_top",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x2e87,
                                                  "void nk_tt__rasterize_sorted_edges(struct nk_tt__bitmap *, struct nk_tt__edge *, int, int, int, int, struct nk_allocator *)"
                                                  );
                                            }
                                            *(nk_handle *)nVar52.ptr = nVar33;
                                            nVar33 = nVar52;
                                          }
                                        }
                                        pnVar1 = p_00 + 1;
                                        p_00 = p_00 + 1;
                                        fVar81 = pnVar1->y0;
                                      }
                                      local_448.ptr = nVar60.ptr;
                                      local_450.ptr = nVar33.ptr;
                                      uVar44 = local_3d8;
                                      uVar31 = local_248;
                                      for (; (nk_tt__active_edge *)nVar33.ptr !=
                                             (nk_tt__active_edge *)0x0; nVar33 = *nVar33.ptr) {
                                        fVar81 = *(float *)((long)nVar33.ptr + 0x1c);
                                        local_3d8 = uVar44;
                                        local_248 = uVar31;
                                        if (fVar81 < fVar76) {
                                          __assert_fail("e->ey >= y_top",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x2dbd,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                  );
                                        }
                                        fVar82 = *(float *)((long)nVar33.ptr + 8);
                                        fVar84 = *(float *)((long)nVar33.ptr + 0xc);
                                        if ((fVar84 != 0.0) || (NAN(fVar84))) {
                                          fVar85 = *(float *)((long)nVar33.ptr + 0x18);
                                          if (fVar80 < fVar85) {
                                            __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x2dcf,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                  );
                                          }
                                          fVar87 = fVar84 + fVar82;
                                          fVar86 = (float)(~-(uint)(fVar76 < fVar85) & (uint)fVar82
                                                          | (uint)((fVar85 - fVar76) * fVar84 +
                                                                  fVar82) & -(uint)(fVar76 < fVar85)
                                                          );
                                          if ((((fVar86 < 0.0) ||
                                               (fVar88 = (float)(~-(uint)(fVar81 < fVar80) &
                                                                 (uint)fVar87 |
                                                                (uint)((fVar81 - fVar76) * fVar84 +
                                                                      fVar82) &
                                                                -(uint)(fVar81 < fVar80)),
                                               fVar88 < 0.0)) || (fVar83 <= fVar86)) ||
                                             (fVar83 <= fVar88)) {
                                            if ((uint)local_410 < 0x7fffffff) {
                                              local_3e8 = ZEXT416((uint)fVar82);
                                              uVar44 = local_400 >> 0x20;
                                              local_400 = CONCAT44((int)uVar44,fVar84);
                                              uVar25 = 0;
                                              do {
                                                fVar81 = (float)(int)uVar25;
                                                uVar57 = uVar25 + 1;
                                                fVar86 = (float)(int)uVar57;
                                                fVar85 = (fVar81 - fVar82) / fVar84 + fVar76;
                                                fVar84 = ((fVar81 + 1.0) - fVar82) / fVar84 + fVar76
                                                ;
                                                if ((fVar81 <= fVar82) || (fVar87 <= fVar86)) {
                                                  if ((fVar81 <= fVar87) || (fVar82 <= fVar86)) {
                                                    fVar88 = fVar76;
                                                    if (((fVar81 <= fVar82) || (fVar87 <= fVar81))
                                                       && ((fVar81 <= fVar87 || (fVar82 <= fVar81)))
                                                       ) {
                                                      fVar85 = fVar76;
                                                      if (((fVar82 < fVar86) && (fVar86 < fVar87))
                                                         || ((fVar81 = fVar82, fVar87 < fVar86 &&
                                                             (fVar86 < fVar82)))) goto LAB_001187dd;
                                                      goto LAB_00118891;
                                                    }
                                                  }
                                                  else {
                                                    nk_tt__handle_clipped_edge
                                                              ((float *)pnVar32,uVar25,
                                                               (nk_tt__active_edge *)nVar33.ptr,
                                                               fVar82,fVar76,fVar86,fVar84);
                                                    fVar82 = fVar86;
                                                    fVar88 = fVar84;
                                                  }
                                                  nk_tt__handle_clipped_edge
                                                            ((float *)pnVar32,uVar25,
                                                             (nk_tt__active_edge *)nVar33.ptr,fVar82
                                                             ,fVar88,fVar81,fVar85);
                                                }
                                                else {
                                                  nk_tt__handle_clipped_edge
                                                            ((float *)pnVar32,uVar25,
                                                             (nk_tt__active_edge *)nVar33.ptr,fVar82
                                                             ,fVar76,fVar81,fVar85);
                                                  fVar82 = fVar81;
LAB_001187dd:
                                                  nk_tt__handle_clipped_edge
                                                            ((float *)pnVar32,uVar25,
                                                             (nk_tt__active_edge *)nVar33.ptr,fVar82
                                                             ,fVar85,fVar86,fVar84);
                                                  fVar81 = fVar86;
                                                  fVar85 = fVar84;
                                                }
LAB_00118891:
                                                nk_tt__handle_clipped_edge
                                                          ((float *)pnVar32,uVar25,
                                                           (nk_tt__active_edge *)nVar33.ptr,fVar81,
                                                           fVar85,fVar87,fVar80);
                                                fVar84 = (float)local_400;
                                                fVar82 = (float)local_3e8._0_4_;
                                                uVar25 = uVar57;
                                              } while (uVar42 != uVar57);
                                            }
                                          }
                                          else {
                                            if (fVar85 <= fVar76) {
                                              fVar85 = fVar76;
                                            }
                                            uVar25 = (uint)fVar86;
                                            if (fVar80 <= fVar81) {
                                              fVar81 = fVar80;
                                            }
                                            if (uVar25 == (int)fVar88) {
                                              if (((int)uVar25 < 0) || ((int)uVar42 <= (int)uVar25))
                                              {
                                                __assert_fail("x >= 0 && x < len",
                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x2dec,
                                                  "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                                                  );
                                              }
                                              uVar44 = (ulong)uVar25;
                                              (&pnVar32->id)[uVar44] =
                                                   (int)((((fVar88 - (float)(int)uVar25) +
                                                          (fVar86 - (float)(int)uVar25)) * -0.5 +
                                                         1.0) * *(float *)((long)nVar33.ptr + 0x14)
                                                         * (fVar81 - fVar85) +
                                                        (float)(&pnVar32->id)[uVar44]);
                                              fVar82 = (fVar81 - fVar85) *
                                                       *(float *)((long)nVar33.ptr + 0x14);
                                            }
                                            else {
                                              fVar84 = *(float *)((long)nVar33.ptr + 0x10);
                                              fVar89 = fVar88;
                                              if (fVar88 < fVar86) {
                                                fVar82 = fVar76 - fVar85;
                                                fVar85 = (fVar76 - fVar81) + fVar80;
                                                fVar84 = -fVar84;
                                                fVar81 = fVar82 + fVar80;
                                                fVar89 = fVar86;
                                                fVar82 = fVar87;
                                                fVar86 = fVar88;
                                              }
                                              iVar43 = (int)fVar89;
                                              fVar88 = (((float)(int)fVar86 + 1.0) - fVar82) *
                                                       fVar84 + fVar76;
                                              fVar82 = *(float *)((long)nVar33.ptr + 0x14);
                                              fVar87 = (fVar88 - fVar85) * fVar82;
                                              lVar27 = (long)(int)fVar86;
                                              iVar59 = (int)fVar86 + 1;
                                              (&pnVar32->id)[lVar27] =
                                                   (int)((((fVar86 - (float)(int)fVar86) + 1.0) *
                                                          -0.5 + 1.0) * fVar87 +
                                                        (float)(&pnVar32->id)[lVar27]);
                                              iVar17 = iVar43 - iVar59;
                                              if (iVar17 != 0 && iVar59 <= iVar43) {
                                                do {
                                                  *(float *)(&pnVar32->w + lVar27 * 2) =
                                                       fVar84 * fVar82 * 0.5 + fVar87 +
                                                       *(float *)(&pnVar32->w + lVar27 * 2);
                                                  fVar87 = fVar87 + fVar84 * fVar82;
                                                  lVar27 = lVar27 + 1;
                                                } while (iVar43 + -1 != (int)lVar27);
                                              }
                                              uVar44 = (ulong)iVar43;
                                              (&pnVar32->id)[uVar44] =
                                                   (int)((fVar81 - (fVar84 * (float)iVar17 + fVar88)
                                                         ) * (((fVar89 - (float)iVar43) + 0.0) *
                                                              -0.5 + 1.0) * fVar82 + fVar87 +
                                                        (float)(&pnVar32->id)[uVar44]);
                                              fVar82 = (fVar81 - fVar85) * fVar82;
                                            }
                                            *(float *)(local_330 + uVar44 * 2) =
                                                 fVar82 + *(float *)(local_330 + uVar44 * 2);
                                          }
                                        }
                                        else if (fVar82 < fVar83) {
                                          if (0.0 <= fVar82) {
                                            local_3e8 = ZEXT416((uint)fVar82);
                                            nk_tt__handle_clipped_edge
                                                      ((float *)pnVar32,(int)fVar82,
                                                       (nk_tt__active_edge *)nVar33.ptr,fVar82,
                                                       fVar76,fVar82,fVar80);
                                            iVar43 = (int)fVar82 + 1;
                                            fVar82 = (float)local_3e8._0_4_;
                                          }
                                          else {
                                            iVar43 = 0;
                                          }
                                          nk_tt__handle_clipped_edge
                                                    ((float *)local_428,iVar43,
                                                     (nk_tt__active_edge *)nVar33.ptr,fVar82,fVar76,
                                                     fVar82,fVar80);
                                        }
                                        uVar44 = local_3d8;
                                        uVar31 = local_248;
                                      }
                                      nVar60 = local_450;
                                      if ((uint)local_410 < 0x7fffffff) {
                                        fVar76 = 0.0;
                                        uVar61 = uVar44 & 0xffffffff;
                                        pnVar34 = pnVar32;
                                        lVar27 = local_260;
                                        do {
                                          fVar76 = fVar76 + (float)(&pnVar34->id)[local_260];
                                          fVar81 = (float)pnVar34->id + fVar76;
                                          fVar80 = -fVar81;
                                          if (-fVar81 <= fVar81) {
                                            fVar80 = fVar81;
                                          }
                                          iVar43 = (int)(fVar80 * 255.0 + 0.5);
                                          uVar58 = (undefined1)iVar43;
                                          if (0xfe < iVar43) {
                                            uVar58 = 0xff;
                                          }
                                          *(undefined1 *)(local_348 + (int)uVar61) = uVar58;
                                          uVar61 = (ulong)((int)uVar61 + 1);
                                          pnVar34 = (nk_rp_rect *)&pnVar34->w;
                                          lVar27 = lVar27 + -1;
                                        } while (lVar27 != 0);
                                      }
                                      for (; (nk_tt__active_edge *)nVar60.ptr !=
                                             (nk_tt__active_edge *)0x0; nVar60 = *nVar60.ptr) {
                                        *(float *)((long)nVar60.ptr + 8) =
                                             *(float *)((long)nVar60.ptr + 0xc) +
                                             *(float *)((long)nVar60.ptr + 8);
                                      }
                                      iVar16 = iVar16 + 1;
                                      local_248 = (ulong)((uint)uVar31 + 1);
                                      local_3d8 = (ulong)(uint)((int)uVar44 + local_3ec);
                                      nVar33 = local_448;
                                      nVar60 = local_338;
                                      nVar36 = local_2f0;
                                    } while ((uint)uVar31 != uVar56);
                                  }
                                  else {
                                    nVar33.ptr = (void *)0x0;
                                    uVar44 = local_3d8;
                                    nVar36 = local_2f0;
                                    uVar31 = local_248;
                                  }
                                  while (local_248 = uVar31, local_3d8 = uVar44, nVar52 = local_2f0,
                                        nVar35 = local_338, local_338 = nVar60, local_2f0 = nVar36,
                                        (nk_handle *)nVar33.ptr != (nk_handle *)0x0) {
                                    nVar60 = *nVar33.ptr;
                                    (*(code *)nVar52)(nVar35,nVar33.ptr);
                                    nVar33 = nVar60;
                                    uVar44 = local_3d8;
                                    nVar60 = local_338;
                                    nVar36 = local_2f0;
                                    uVar31 = local_248;
                                    local_2f0 = nVar52;
                                    local_338 = nVar35;
                                  }
                                  if (pnVar32 != &local_238) {
                                    (*(code *)alloc[2])(*alloc,pnVar32);
                                  }
                                  (*(code *)alloc[2])(*alloc,local_408);
                                }
                                (*(code *)alloc[2])(*alloc,pvVar48);
                                (*(code *)alloc[2])(*alloc,local_3a8);
                              }
                            }
                          }
                          (*(code *)alloc[2])(*alloc,(void *)CONCAT44(local_3d0._4_4_,(int)local_3d0
                                                                     ));
                          uVar42 = alloc[6].id;
                          uVar44 = (ulong)(int)uVar42;
                          if ((1 < uVar44) && (uVar39 = *(ushort *)(local_418 + 6), uVar39 != 0)) {
                            iVar43 = alloc[5].id;
                            uVar40 = *(ushort *)(local_418 + 4);
                            uVar25 = (uint)uVar40;
                            lVar27 = (long)alloc[7].ptr +
                                     (ulong)*(ushort *)(local_418 + 10) * (long)iVar43 +
                                     (ulong)*(ushort *)(local_418 + 8);
                            uVar31 = uVar44 - local_358;
                            uVar56 = 0;
                            do {
                              if (uVar42 < 0xc) {
                                pnVar32 = &local_238;
                                uVar62 = uVar44;
LAB_00118ed0:
                                memset(pnVar32,0,uVar62);
                              }
                              else {
                                uVar61 = uVar44;
                                pnVar32 = &local_238;
                                if (local_250 != 0) {
                                  memset(&local_238,0,local_358);
                                  uVar61 = uVar31;
                                  pnVar32 = local_270;
                                }
                                memset(pnVar32,0,uVar61 & 0xfffffffffffffffc);
                                uVar62 = uVar61 & 3;
                                if (uVar62 != 0) {
                                  pnVar32 = (nk_rp_rect *)
                                            ((long)&pnVar32->id + (uVar61 & 0xfffffffffffffffc));
                                  goto LAB_00118ed0;
                                }
                              }
                              if (uVar42 - 2 < 4) {
                                pvVar48 = (void *)(*(code *)(&DAT_001523a8 +
                                                            *(int *)(&DAT_001523a8 +
                                                                    (ulong)(uVar42 - 2) * 4)))();
                                return pvVar48;
                              }
                              if ((int)(uint)uVar40 < (int)uVar42) {
                                uVar61 = 0;
                                uVar57 = 0;
                              }
                              else {
                                uVar61 = 0;
                                uVar57 = 0;
                                do {
                                  bVar5 = *(byte *)(lVar27 + uVar61);
                                  bVar7 = *(byte *)((long)&local_238.id + (ulong)((uint)uVar61 & 7))
                                  ;
                                  *(byte *)((long)&local_238.id + (ulong)(uVar42 + (uint)uVar61 & 7)
                                           ) = bVar5;
                                  uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                  *(char *)(lVar27 + uVar61) = (char)(uVar57 / uVar42);
                                  uVar61 = uVar61 + 1;
                                } while ((uVar25 - uVar42) + 1 != uVar61);
                              }
                              if ((int)uVar61 < (int)uVar25) {
                                uVar61 = uVar61 & 0xffffffff;
                                do {
                                  if (*(char *)(lVar27 + uVar61) != '\0') {
                                    __assert_fail("pixels[i] == 0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x3048,
                                                  "void nk_tt__h_prefilter(unsigned char *, int, int, int, int)"
                                                 );
                                  }
                                  uVar57 = uVar57 - *(byte *)((long)&local_238.id +
                                                             (ulong)((uint)uVar61 & 7));
                                  *(char *)(lVar27 + uVar61) = (char)(uVar57 / uVar42);
                                  uVar61 = uVar61 + 1;
                                } while ((int)uVar61 < (int)uVar25);
                              }
                              lVar27 = lVar27 + iVar43;
                              uVar56 = uVar56 + 1;
                            } while (uVar56 != uVar39);
                          }
                          uVar42 = *(uint *)((long)alloc + 0x34);
                          uVar44 = (ulong)(int)uVar42;
                          fVar83 = (float)local_3c8;
                          if ((1 < uVar44) && (uVar39 = *(ushort *)(local_418 + 4), uVar39 != 0)) {
                            lVar27 = (long)alloc[5].id;
                            uVar25 = (uint)*(ushort *)(local_418 + 6);
                            pbVar66 = (byte *)((long)alloc[7].ptr +
                                              (ulong)*(ushort *)(local_418 + 10) * lVar27 +
                                              (ulong)*(ushort *)(local_418 + 8));
                            uVar31 = uVar44 - local_360;
                            uVar61 = (ulong)((uVar25 - uVar42) + 1);
                            uVar56 = 0;
                            do {
                              if (uVar42 < 0xc) {
                                pnVar32 = &local_238;
                                uVar71 = uVar44;
LAB_001191c9:
                                memset(pnVar32,0,uVar71);
                              }
                              else {
                                uVar62 = uVar44;
                                pnVar32 = &local_238;
                                if (local_258 != 0) {
                                  memset(&local_238,0,local_360);
                                  uVar62 = uVar31;
                                  pnVar32 = local_278;
                                }
                                memset(pnVar32,0,uVar62 & 0xfffffffffffffffc);
                                uVar71 = uVar62 & 3;
                                if (uVar71 != 0) {
                                  pnVar32 = (nk_rp_rect *)
                                            ((long)&pnVar32->id + (uVar62 & 0xfffffffffffffffc));
                                  goto LAB_001191c9;
                                }
                              }
                              switch(uVar42) {
                              case 2:
                                if ((int)uVar25 < (int)uVar42) {
LAB_0011934b:
                                  uVar62 = 0;
                                  uVar57 = 0;
                                }
                                else {
                                  uVar62 = 0;
                                  uVar57 = 0;
                                  pbVar64 = pbVar66;
                                  do {
                                    bVar5 = *pbVar64;
                                    bVar7 = *(byte *)((long)&local_238.id +
                                                     (ulong)((uint)uVar62 & 7));
                                    *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 + 2 & 7)) =
                                         bVar5;
                                    uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                    *pbVar64 = (byte)(uVar57 >> 1);
                                    uVar62 = uVar62 + 1;
                                    pbVar64 = pbVar64 + lVar27;
                                  } while (uVar61 != uVar62);
                                }
                                break;
                              case 3:
                                if ((int)uVar25 < (int)uVar42) goto LAB_0011934b;
                                uVar62 = 0;
                                uVar57 = 0;
                                pbVar64 = pbVar66;
                                do {
                                  bVar5 = *pbVar64;
                                  bVar7 = *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 & 7))
                                  ;
                                  *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 + 3 & 7)) =
                                       bVar5;
                                  uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                  *pbVar64 = (byte)(uVar57 / 3);
                                  uVar62 = uVar62 + 1;
                                  pbVar64 = pbVar64 + lVar27;
                                } while (uVar61 != uVar62);
                                break;
                              case 4:
                                if ((int)uVar25 < (int)uVar42) goto LAB_0011934b;
                                uVar62 = 0;
                                uVar57 = 0;
                                pbVar64 = pbVar66;
                                do {
                                  bVar5 = *pbVar64;
                                  uVar71 = (ulong)((uint)uVar62 & 7);
                                  bVar7 = *(byte *)((long)&local_238.id + uVar71);
                                  *(byte *)((long)&local_238.id + (uVar71 ^ 4)) = bVar5;
                                  uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                  *pbVar64 = (byte)(uVar57 >> 2);
                                  uVar62 = uVar62 + 1;
                                  pbVar64 = pbVar64 + lVar27;
                                } while (uVar61 != uVar62);
                                break;
                              case 5:
                                if ((int)uVar25 < (int)uVar42) goto LAB_0011934b;
                                uVar62 = 0;
                                uVar57 = 0;
                                pbVar64 = pbVar66;
                                do {
                                  bVar5 = *pbVar64;
                                  bVar7 = *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 & 7))
                                  ;
                                  *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 + 5 & 7)) =
                                       bVar5;
                                  uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                  *pbVar64 = (byte)(uVar57 / 5);
                                  uVar62 = uVar62 + 1;
                                  pbVar64 = pbVar64 + lVar27;
                                } while (uVar61 != uVar62);
                                break;
                              default:
                                if ((int)uVar25 < (int)uVar42) goto LAB_0011934b;
                                uVar62 = 0;
                                uVar57 = 0;
                                pbVar64 = pbVar66;
                                do {
                                  bVar5 = *pbVar64;
                                  bVar7 = *(byte *)((long)&local_238.id + (ulong)((uint)uVar62 & 7))
                                  ;
                                  *(byte *)((long)&local_238.id + (ulong)(uVar42 + (uint)uVar62 & 7)
                                           ) = bVar5;
                                  uVar57 = uVar57 + ((uint)bVar5 - (uint)bVar7);
                                  *pbVar64 = (byte)(uVar57 / uVar42);
                                  uVar62 = uVar62 + 1;
                                  pbVar64 = pbVar64 + lVar27;
                                } while (uVar61 != uVar62);
                              }
                              iVar43 = (int)uVar62;
                              iVar16 = uVar25 - iVar43;
                              if (iVar16 != 0 && iVar43 <= (int)uVar25) {
                                lVar51 = (long)iVar43;
                                pbVar64 = pbVar66 + lVar27 * lVar51;
                                do {
                                  if (*pbVar64 != 0) {
                                    __assert_fail("pixels[i*stride_in_bytes] == 0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                                                  ,0x3087,
                                                  "void nk_tt__v_prefilter(unsigned char *, int, int, int, int)"
                                                 );
                                  }
                                  uVar57 = uVar57 - *(byte *)((long)&local_238.id +
                                                             (ulong)((uint)lVar51 & 7));
                                  *pbVar64 = (byte)(uVar57 / uVar42);
                                  lVar51 = lVar51 + 1;
                                  pbVar64 = pbVar64 + lVar27;
                                  iVar16 = iVar16 + -1;
                                } while (iVar16 != 0);
                              }
                              pbVar66 = pbVar66 + 1;
                              uVar56 = uVar56 + 1;
                              fVar83 = (float)local_3c8;
                            } while (uVar56 != uVar39);
                          }
                          uVar77 = *(undefined4 *)(local_418 + 8);
                          *local_290 = (short)uVar77;
                          sVar8 = *(short *)(local_418 + 10);
                          local_290[1] = sVar8;
                          uVar39 = *(ushort *)(local_418 + 4);
                          local_290[2] = (short)uVar77 + uVar39;
                          uVar40 = *(ushort *)(local_418 + 6);
                          local_290[3] = sVar8 + uVar40;
                          *(float *)(local_290 + 8) =
                               (float)(int)(short)((short)(local_380 << 8) + (short)local_384) *
                               fVar83;
                          *(float *)(local_290 + 4) = (float)local_378 * local_38c + local_3f4;
                          *(float *)(local_290 + 6) = (float)local_37c * local_390 + local_3f0;
                          *(float *)(local_290 + 10) =
                               ((float)uVar39 + (float)local_378) * local_38c + local_3f4;
                          fVar83 = ((float)uVar40 + (float)local_37c) * local_390 + local_3f0;
                          *(float *)(local_290 + 0xc) = fVar83;
                          lVar51 = local_288;
                          lVar53 = local_2d8;
                          puVar70 = local_2e8;
                          lVar27 = local_280;
                        }
                        lVar27 = lVar27 + 1;
                        lVar51 = lVar51 + 1;
                      } while (lVar51 < *(int *)(lVar53 + 0x10));
                    }
                    lVar51 = local_2f8 + 1;
                  } while (lVar51 != local_300);
                }
                lVar51 = local_308 + 1;
                alloc[6].id = local_394;
                *(undefined4 *)((long)alloc + 0x34) = local_398;
                pnVar38 = local_310->n;
              } while (pnVar38 != local_320);
            } while (((int)lVar51 < iVar55) &&
                    (pnVar38 = local_320->next, pnVar38 != (nk_font_config *)0x0));
            (*(code *)alloc[2])(*alloc,alloc[8].ptr);
            (*(code *)alloc[2])(*alloc,alloc[3].ptr);
            if (0 < iVar55) {
              pvVar48 = alloc[9].ptr;
              fVar83 = (float)local_3a0;
              fVar76 = (float)(int)local_328;
              lVar27 = 0;
              nVar46 = 0;
              do {
                lVar27 = (long)(int)lVar27;
                pnVar38 = local_420;
                do {
                  plVar2 = (long *)((long)pvVar48 + lVar27 * 0x48);
                  pnVar12 = pnVar38->font;
                  if (pnVar38->merge_mode == '\0') {
                    fVar80 = pnVar38->size;
                    lVar51 = *plVar2;
                    lVar53 = (long)*(int *)((long)plVar2 + 0x1c);
                    uVar56 = (int)(short)((ushort)*(byte *)(lVar51 + 4 + lVar53) << 8) |
                             (uint)*(byte *)(lVar51 + 5 + lVar53);
                    uVar42 = (int)(short)((ushort)*(byte *)(lVar51 + 6 + lVar53) << 8) |
                             (uint)*(byte *)(lVar51 + 7 + lVar53);
                    pnVar12->ranges = pnVar38->range;
                    pnVar12->height = fVar80;
                    fVar80 = fVar80 / (float)(int)(uVar56 - uVar42);
                    pnVar12->ascent = (float)(int)uVar56 * fVar80;
                    pnVar12->descent = (float)(int)uVar42 * fVar80;
                    pnVar12->glyph_offset = nVar46;
                    pnVar12->glyph_count = 0;
                  }
                  uVar42 = *(uint *)(plVar2 + 8);
                  if ((ulong)uVar42 == 0) {
                    iVar43 = 0;
                  }
                  else {
                    lVar51 = plVar2[7];
                    uVar44 = 0;
                    iVar43 = 0;
                    do {
                      lVar53 = (long)*(int *)(lVar51 + 0x10 + uVar44 * 0x28);
                      if (0 < lVar53) {
                        lVar3 = lVar51 + uVar44 * 0x28;
                        puVar74 = *(ushort **)(lVar3 + 0x18);
                        lVar67 = 0;
                        do {
                          if ((((*puVar74 != 0) || (puVar74[2] != 0)) || (puVar74[1] != 0)) ||
                             (puVar74[3] != 0)) {
                            fVar80 = *(float *)(puVar74 + 4);
                            fVar81 = *(float *)(puVar74 + 6);
                            fVar82 = *(float *)(puVar74 + 10);
                            fVar84 = *(float *)(puVar74 + 0xc);
                            fVar86 = (float)*puVar74 * (1.0 / fVar76);
                            fVar87 = (float)puVar74[1] * (1.0 / fVar83);
                            fVar88 = (float)puVar74[2] * (1.0 / fVar76);
                            fVar85 = (float)puVar74[3] * (1.0 / fVar83);
                            uVar56 = pnVar12->glyph_offset + iVar43 + pnVar12->glyph_count;
                            local_2e0[uVar56].codepoint = *(int *)(lVar3 + 4) + (int)lVar67;
                            local_2e0[uVar56].x0 = fVar80 + 0.0;
                            local_2e0[uVar56].y0 = fVar81 + 0.0;
                            local_2e0[uVar56].x1 = fVar82 + 0.0;
                            local_2e0[uVar56].y1 = fVar84 + 0.0;
                            fVar89 = pnVar12->ascent + 0.5;
                            fVar81 = fVar81 + 0.0 + fVar89;
                            local_2e0[uVar56].y0 = fVar81;
                            fVar89 = fVar89 + fVar84 + 0.0;
                            local_2e0[uVar56].y1 = fVar89;
                            local_2e0[uVar56].w = ((fVar82 + 0.0) - (fVar80 + 0.0)) + 0.5;
                            local_2e0[uVar56].h = fVar89 - fVar81;
                            if (pnVar38->coord_type == NK_COORD_PIXEL) {
                              local_2e0[uVar56].u0 = fVar86 * fVar76;
                              local_2e0[uVar56].v0 = fVar87 * fVar83;
                              local_2e0[uVar56].u1 = fVar88 * fVar76;
                              fVar85 = fVar85 * fVar83;
                            }
                            else {
                              local_2e0[uVar56].u0 = fVar86;
                              local_2e0[uVar56].v0 = fVar87;
                              local_2e0[uVar56].u1 = fVar88;
                            }
                            local_2e0[uVar56].v1 = fVar85;
                            fVar80 = *(float *)(puVar74 + 8) + (pnVar38->spacing).x;
                            local_2e0[uVar56].xadvance = fVar80;
                            if (pnVar38->pixel_snap != '\0') {
                              local_2e0[uVar56].xadvance = (float)(int)(fVar80 + 0.5);
                            }
                            iVar43 = iVar43 + 1;
                          }
                          lVar67 = lVar67 + 1;
                          puVar74 = puVar74 + 0xe;
                        } while (lVar53 != lVar67);
                      }
                      uVar44 = uVar44 + 1;
                    } while (uVar44 != uVar42);
                  }
                  pnVar12->glyph_count = pnVar12->glyph_count + iVar43;
                  lVar27 = lVar27 + 1;
                  nVar46 = nVar46 + iVar43;
                  pnVar38 = pnVar38->n;
                } while (pnVar38 != local_420);
              } while (((int)lVar27 < iVar55) &&
                      (local_420 = local_420->next, local_420 != (nk_font_config *)0x0));
            }
          }
        }
        pvVar48 = atlas->pixel;
        if (pvVar48 == (void *)0x0) {
          __assert_fail("img_memory",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x32a3,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        iVar43 = *width;
        if (iVar43 == 0) {
          __assert_fail("img_width",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x32a4,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        if (*height == 0) {
          __assert_fail("img_height",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x32a5,
                        "void nk_font_bake_custom_data(void *, int, int, struct nk_recti, const char *, int, int, char, char)"
                       );
        }
        iVar55._0_2_ = (atlas->custom).x;
        iVar55._2_2_ = (atlas->custom).y;
        iVar55 = (iVar55 >> 0x10) * iVar43 + (int)(short)(undefined2)iVar55;
        iVar16 = 0;
        lVar27 = 0;
        do {
          lVar51 = 0;
          do {
            cVar6 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....XX           -  X.X  - X.....X -        X.....X        -X...X            -            X...XXX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..XX.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.XX..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XXX...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        X......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         X.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          X........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           X.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            X..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           X......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          X...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       ------------------------------------X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           XX    X..X  -       - X.....X -        X.....X        -   X.X           X.X   -                 X..X          -  X...X  -         X...X         -  X..X           X..X  -                  XX           -   X.X   -          X.X          - X...XXXXXXXXXXXXX...X -           ------------        -    X    -           X           -X..............." /* TRUNCATED STRING LITERAL */
                    [(int)lVar27 + lVar51];
            lVar53 = (long)(iVar55 + (int)lVar51);
            *(char *)((long)pvVar48 + lVar53) = -(cVar6 == '.');
            *(char *)((long)pvVar48 + lVar53 + 0x5b) = -(cVar6 == 'X');
            lVar51 = lVar51 + 1;
          } while (lVar51 != 0x5a);
          iVar16 = iVar16 + 1;
          lVar27 = (long)(int)lVar27 + 0x5a;
          iVar55 = iVar55 + iVar43;
        } while (iVar16 != 0x1b);
        if (local_39c == NK_FONT_ATLAS_RGBA32) {
          pvVar48 = (*(atlas->temporary).alloc)
                              ((atlas->temporary).userdata,(void *)0x0,(long)(*width * *height * 4))
          ;
          if (pvVar48 == (void *)0x0) {
            __assert_fail("img_rgba",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x35d3,
                          "const void *nk_font_atlas_bake(struct nk_font_atlas *, int *, int *, enum nk_font_atlas_format)"
                         );
          }
          pvVar13 = atlas->pixel;
          if (pvVar13 == (void *)0x0) {
            __assert_fail("in_memory",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x32be,"void nk_font_bake_convert(void *, int, int, const void *)");
          }
          if (*width == 0) {
            __assert_fail("img_width",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x32bf,"void nk_font_bake_convert(void *, int, int, const void *)");
          }
          if (*height == 0) {
            __assert_fail("img_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x32c0,"void nk_font_bake_convert(void *, int, int, const void *)");
          }
          iVar43 = *height * *width;
          if (0 < iVar43) {
            iVar43 = iVar43 + 1;
            lVar27 = 0;
            do {
              *(uint *)((long)pvVar48 + lVar27 * 4) =
                   (uint)*(byte *)((long)pvVar13 + lVar27) << 0x18 | 0xffffff;
              lVar27 = lVar27 + 1;
              iVar43 = iVar43 + -1;
            } while (1 < iVar43);
          }
          (*(atlas->temporary).free)((atlas->temporary).userdata,pvVar13);
          atlas->pixel = pvVar48;
        }
        atlas->tex_width = *width;
        atlas->tex_height = *height;
        for (pnVar26 = atlas->fonts; pnVar26 != (nk_font *)0x0; pnVar26 = pnVar26->next) {
          pnVar28 = atlas->glyphs;
          if (pnVar28 == (nk_font_glyph *)0x0) {
            __assert_fail("glyphs",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x332d,
                          "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                         );
          }
          pnVar38 = pnVar26->config;
          pnVar12 = pnVar38->font;
          if (pnVar12 == (nk_baked_font *)0x0) {
            __assert_fail("baked_font",
                          "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                          ,0x332e,
                          "void nk_font_init(struct nk_font *, float, nk_rune, struct nk_font_glyph *, const struct nk_baked_font *, nk_handle)"
                         );
          }
          fVar83 = pnVar38->size;
          nVar46 = pnVar38->fallback_glyph;
          local_238.id = (int)pnVar12->height;
          local_238._4_4_ = pnVar12->ascent;
          local_238._8_8_ = *(undefined8 *)&pnVar12->descent;
          local_228 = *(undefined8 *)&pnVar12->glyph_count;
          pnStack_220 = pnVar12->ranges;
          pnVar26->fallback = (nk_font_glyph *)0x0;
          (pnVar26->info).height = (float)local_238.id;
          (pnVar26->info).ascent = (float)local_238._4_4_;
          *(undefined8 *)&(pnVar26->info).descent = local_238._8_8_;
          *(undefined8 *)&(pnVar26->info).glyph_count = local_228;
          (pnVar26->info).ranges = pnStack_220;
          pnVar26->scale = fVar83 / (pnVar26->info).height;
          pnVar26->glyphs = pnVar28 + pnVar12->glyph_offset;
          (pnVar26->texture).ptr = (void *)0x0;
          pnVar26->fallback_codepoint = nVar46;
          pnVar28 = nk_font_find_glyph(pnVar26,nVar46);
          pnVar26->fallback = pnVar28;
          (pnVar26->handle).height = (pnVar26->info).height * pnVar26->scale;
          (pnVar26->handle).width = nk_font_text_width;
          (pnVar26->handle).userdata.ptr = pnVar26;
          (pnVar26->handle).query = nk_font_query_font_glyph;
          (pnVar26->handle).texture = pnVar26->texture;
        }
        sVar8 = (atlas->custom).x;
        sVar9 = (atlas->custom).y;
        pnVar37 = nk_font_atlas_bake::nk_cursor_data[0] + 2;
        lVar27 = 0x68;
        do {
          *(short *)((long)(&atlas->cursors[0].img + -4) + lVar27) = (short)*width;
          *(short *)((long)atlas->cursors[0].img.region + lVar27 + -0x6a) = (short)*height;
          *(short *)((long)atlas->cursors[0].img.region + lVar27 + -0x68) =
               (short)(int)(pnVar37[-2].x + (float)(int)sVar8);
          *(short *)((long)atlas->cursors[0].img.region + lVar27 + -0x66) =
               (short)(int)(pnVar37[-2].y + (float)(int)sVar9);
          *(short *)((long)atlas->cursors[0].img.region + lVar27 + -100) = (short)(int)pnVar37[-1].x
          ;
          *(short *)((long)atlas->cursors[0].img.region + lVar27 + -0x62) =
               (short)(int)pnVar37[-1].y;
          nVar15 = *pnVar37;
          pnVar4 = (nk_vec2 *)((long)(atlas->cursors + -2) + lVar27);
          *pnVar4 = pnVar37[-1];
          pnVar4[1] = nVar15;
          pnVar37 = pnVar37 + 3;
          lVar27 = lVar27 + 0x28;
        } while (lVar27 != 0x180);
        (*(atlas->temporary).free)((atlas->temporary).userdata,local_370);
        pvVar48 = atlas->pixel;
      }
      return pvVar48;
    }
  } while( true );
}

Assistant:

NK_API const void*
nk_font_atlas_bake(struct nk_font_atlas *atlas, int *width, int *height,
    enum nk_font_atlas_format fmt)
{
    int i = 0;
    void *tmp = 0;
    nk_size tmp_size, img_size;
    struct nk_font *font_iter;
    struct nk_font_baker *baker;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(width);
    NK_ASSERT(height);
    if (!atlas || !width || !height ||
        !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

#ifdef NK_INCLUDE_DEFAULT_FONT
    /* no font added so just use default font */
    if (!atlas->font_num)
        atlas->default_font = nk_font_atlas_add_default(atlas, 13.0f, 0);
#endif
    NK_ASSERT(atlas->font_num);
    if (!atlas->font_num) return 0;

    /* allocate temporary baker memory required for the baking process */
    nk_font_baker_memory(&tmp_size, &atlas->glyph_count, atlas->config, atlas->font_num);
    tmp = atlas->temporary.alloc(atlas->temporary.userdata,0, tmp_size);
    NK_ASSERT(tmp);
    if (!tmp) goto failed;

    /* allocate glyph memory for all fonts */
    baker = nk_font_baker(tmp, atlas->glyph_count, atlas->font_num, &atlas->temporary);
    atlas->glyphs = (struct nk_font_glyph*)atlas->permanent.alloc(
        atlas->permanent.userdata,0, sizeof(struct nk_font_glyph)*(nk_size)atlas->glyph_count);
    NK_ASSERT(atlas->glyphs);
    if (!atlas->glyphs)
        goto failed;

    /* pack all glyphs into a tight fit space */
    atlas->custom.w = (NK_CURSOR_DATA_W*2)+1;
    atlas->custom.h = NK_CURSOR_DATA_H + 1;
    if (!nk_font_bake_pack(baker, &img_size, width, height, &atlas->custom,
        atlas->config, atlas->font_num, &atlas->temporary))
        goto failed;

    /* allocate memory for the baked image font atlas */
    atlas->pixel = atlas->temporary.alloc(atlas->temporary.userdata,0, img_size);
    NK_ASSERT(atlas->pixel);
    if (!atlas->pixel)
        goto failed;

    /* bake glyphs and custom white pixel into image */
    nk_font_bake(baker, atlas->pixel, *width, *height,
        atlas->glyphs, atlas->glyph_count, atlas->config, atlas->font_num);
    nk_font_bake_custom_data(atlas->pixel, *width, *height, atlas->custom,
            nk_custom_cursor_data, NK_CURSOR_DATA_W, NK_CURSOR_DATA_H, '.', 'X');

    if (fmt == NK_FONT_ATLAS_RGBA32) {
        /* convert alpha8 image into rgba32 image */
        void *img_rgba = atlas->temporary.alloc(atlas->temporary.userdata,0,
                            (nk_size)(*width * *height * 4));
        NK_ASSERT(img_rgba);
        if (!img_rgba) goto failed;
        nk_font_bake_convert(img_rgba, *width, *height, atlas->pixel);
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = img_rgba;
    }
    atlas->tex_width = *width;
    atlas->tex_height = *height;

    /* initialize each font */
    for (font_iter = atlas->fonts; font_iter; font_iter = font_iter->next) {
        struct nk_font *font = font_iter;
        struct nk_font_config *config = font->config;
        nk_font_init(font, config->size, config->fallback_glyph, atlas->glyphs,
            config->font, nk_handle_ptr(0));
    }

    /* initialize each cursor */
    {NK_STORAGE const struct nk_vec2 nk_cursor_data[NK_CURSOR_COUNT][3] = {
        /* Pos      Size        Offset */
        {{ 0, 3},   {12,19},    { 0, 0}},
        {{13, 0},   { 7,16},    { 4, 8}},
        {{31, 0},   {23,23},    {11,11}},
        {{21, 0},   { 9, 23},   { 5,11}},
        {{55,18},   {23, 9},    {11, 5}},
        {{73, 0},   {17,17},    { 9, 9}},
        {{55, 0},   {17,17},    { 9, 9}}
    };
    for (i = 0; i < NK_CURSOR_COUNT; ++i) {
        struct nk_cursor *cursor = &atlas->cursors[i];
        cursor->img.w = (unsigned short)*width;
        cursor->img.h = (unsigned short)*height;
        cursor->img.region[0] = (unsigned short)(atlas->custom.x + nk_cursor_data[i][0].x);
        cursor->img.region[1] = (unsigned short)(atlas->custom.y + nk_cursor_data[i][0].y);
        cursor->img.region[2] = (unsigned short)nk_cursor_data[i][1].x;
        cursor->img.region[3] = (unsigned short)nk_cursor_data[i][1].y;
        cursor->size = nk_cursor_data[i][1];
        cursor->offset = nk_cursor_data[i][2];
    }}
    /* free temporary memory */
    atlas->temporary.free(atlas->temporary.userdata, tmp);
    return atlas->pixel;

failed:
    /* error so cleanup all memory */
    if (tmp) atlas->temporary.free(atlas->temporary.userdata, tmp);
    if (atlas->glyphs) {
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
        atlas->glyphs = 0;
    }
    if (atlas->pixel) {
        atlas->temporary.free(atlas->temporary.userdata, atlas->pixel);
        atlas->pixel = 0;
    }
    return 0;
}